

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpfw.c
# Opt level: O0

void emit_queue(queue_t *q,int up,int64_t now)

{
  undefined8 uVar1;
  int64_t now_local;
  int up_local;
  queue_t *q_local;
  
  if (((q->ring).head != (q->ring).tail) && (q->congested_until <= now)) {
    if (up == 0) {
      sendto(listen_fd,(q->ring).elements[(q->ring).head].data,
             (q->ring).elements[(q->ring).head].len,0,
             (sockaddr *)&((q->ring).elements[(q->ring).head].conn)->down_addr,
             (((q->ring).elements[(q->ring).head].conn)->down_addr).len);
    }
    else {
      send(((q->ring).elements[(q->ring).head].conn)->up_fd,(q->ring).elements[(q->ring).head].data,
           (q->ring).elements[(q->ring).head].len,0);
    }
    uVar1 = 100;
    if (up != 0) {
      uVar1 = 0x75;
    }
    fprintf(_stderr,"%ld:%zu:%c:forward\n",now,((q->ring).elements[(q->ring).head].conn)->cid,uVar1)
    ;
    (q->ring).head = ((q->ring).head + 1) % (q->ring).depth;
    q->congested_until = now + q->interval_usec;
  }
  return;
}

Assistant:

static void emit_queue(struct queue_t *q, int up, int64_t now)
{
    if (q->ring.head == q->ring.tail)
        return;
    if (now < q->congested_until)
        return;
    if (up) {
        send(q->ring.elements[q->ring.head].conn->up_fd, q->ring.elements[q->ring.head].data, q->ring.elements[q->ring.head].len,
             0);
    } else {
        sendto(listen_fd, q->ring.elements[q->ring.head].data, q->ring.elements[q->ring.head].len, 0,
               (void *)&q->ring.elements[q->ring.head].conn->down_addr.ss, q->ring.elements[q->ring.head].conn->down_addr.len);
    }
    fprintf(stderr, "%" PRId64 ":%zu:%c:forward\n", now, q->ring.elements[q->ring.head].conn->cid, up ? 'u' : 'd');
    q->ring.head = (q->ring.head + 1) % q->ring.depth;
    q->congested_until = now + q->interval_usec;
}